

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnownFormats.h
# Opt level: O0

Item * __thiscall
jbcoin::KnownFormats<jbcoin::TxType>::add(KnownFormats<jbcoin::TxType> *this,char *name,TxType type)

{
  Item *pIVar1;
  Item *pIVar2;
  reference this_00;
  mapped_type *ppIVar3;
  string *__k;
  mapped_type *ppIVar4;
  TxType local_44;
  Item *local_40;
  Item *item;
  unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>
  local_28;
  TxType local_1c;
  char *pcStack_18;
  TxType type_local;
  char *name_local;
  KnownFormats<jbcoin::TxType> *this_local;
  
  local_1c = type;
  pcStack_18 = name;
  name_local = (char *)this;
  std::make_unique<jbcoin::KnownFormats<jbcoin::TxType>::Item,char_const*&,jbcoin::TxType&>
            ((char **)&local_28,(TxType *)&stack0xffffffffffffffe8);
  std::
  vector<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>>,std::allocator<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>>>>
  ::
  emplace_back<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>>>
            ((vector<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>>,std::allocator<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>>>>
              *)&this->m_formats,&local_28);
  std::
  unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>
  ::~unique_ptr(&local_28);
  this_00 = std::
            vector<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>_>_>
            ::back(&this->m_formats);
  local_40 = std::
             unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>
             ::operator*(this_00);
  (**this->_vptr_KnownFormats)(this,local_40);
  pIVar1 = local_40;
  local_44 = Item::getType(local_40);
  ppIVar3 = std::
            map<jbcoin::TxType,_jbcoin::KnownFormats<jbcoin::TxType>::Item_*,_std::less<jbcoin::TxType>,_std::allocator<std::pair<const_jbcoin::TxType,_jbcoin::KnownFormats<jbcoin::TxType>::Item_*>_>_>
            ::operator[](&this->m_types,&local_44);
  pIVar2 = local_40;
  *ppIVar3 = pIVar1;
  __k = Item::getName_abi_cxx11_(local_40);
  ppIVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::TxType>::Item_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::TxType>::Item_*>_>_>
            ::operator[](&this->m_names,__k);
  *ppIVar4 = pIVar2;
  return local_40;
}

Assistant:

Item& add (char const* name, KeyType type)
    {
        m_formats.emplace_back (
            std::make_unique <Item> (name, type));
        auto& item (*m_formats.back());

        addCommonFields (item);

        m_types [item.getType ()] = &item;
        m_names [item.getName ()] = &item;

        return item;
    }